

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reliveapp.cpp
# Opt level: O0

void __thiscall relive::ReLiveApp::fetchStreams(ReLiveApp *this,Station *station)

{
  bool bVar1;
  reference pvVar2;
  reference pSVar3;
  bool in_stack_000000d7;
  Stream *in_stack_000000d8;
  ReLiveDB *in_stack_000000e0;
  Stream *stream;
  iterator __end2;
  iterator __begin2;
  vector<relive::Stream,_std::allocator<relive::Stream>_> *__range2;
  shared_ptr<relive::Station> parent;
  Station *station_local;
  ReLiveApp *this_local;
  
  parent.super___shared_ptr<relive::Station,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)station;
  bVar1 = std::vector<relive::Stream,_std::allocator<relive::Stream>_>::empty(&station->_streams);
  if (!bVar1) {
    std::vector<relive::Stream,_std::allocator<relive::Stream>_>::operator=
              (&this->_streams,
               (vector<relive::Stream,_std::allocator<relive::Stream>_> *)
               &parent.super___shared_ptr<relive::Station,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi[0xb]._M_use_count);
    std::vector<relive::Stream,_std::allocator<relive::Stream>_>::front(&this->_streams);
    ReLiveDB::deepFetch(in_stack_000000e0,in_stack_000000d8,in_stack_000000d7);
    pvVar2 = std::vector<relive::Stream,_std::allocator<relive::Stream>_>::front(&this->_streams);
    std::shared_ptr<relive::Station>::shared_ptr
              ((shared_ptr<relive::Station> *)&__range2,&pvVar2->_station);
    __end2 = std::vector<relive::Stream,_std::allocator<relive::Stream>_>::begin(&this->_streams);
    stream = (Stream *)
             std::vector<relive::Stream,_std::allocator<relive::Stream>_>::end(&this->_streams);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<relive::Stream_*,_std::vector<relive::Stream,_std::allocator<relive::Stream>_>_>
                                  *)&stream);
      if (!bVar1) break;
      pSVar3 = __gnu_cxx::
               __normal_iterator<relive::Stream_*,_std::vector<relive::Stream,_std::allocator<relive::Stream>_>_>
               ::operator*(&__end2);
      std::shared_ptr<relive::Station>::operator=
                (&pSVar3->_station,(shared_ptr<relive::Station> *)&__range2);
      __gnu_cxx::
      __normal_iterator<relive::Stream_*,_std::vector<relive::Stream,_std::allocator<relive::Stream>_>_>
      ::operator++(&__end2);
    }
    std::shared_ptr<relive::Station>::~shared_ptr((shared_ptr<relive::Station> *)&__range2);
  }
  return;
}

Assistant:

void ReLiveApp::fetchStreams(const Station& station)
{
    if (!station._streams.empty()) {
        _streams = station._streams;
        _rdb.deepFetch(_streams.front(), true);
        auto parent = _streams.front()._station;
        for (auto& stream : _streams) {
            stream._station = parent;
        }
    }
}